

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O1

Lit __thiscall IntVarEL::createSetLit(IntVarEL *this,vec<Lit> *head)

{
  uint uVar1;
  Lit *pLVar2;
  long lVar3;
  Lit q;
  ulong uVar4;
  int *__ptr;
  Clause *c;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int i;
  int iVar10;
  IntVarEL *pIVar11;
  bool bVar12;
  vec<int> holes;
  int v;
  vec<int> local_58;
  IntVarEL *local_48;
  int local_3c;
  ulong local_38;
  
  iVar10 = this->lit_min;
  iVar6 = this->lit_max;
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  uVar4 = (ulong)head->sz;
  if (uVar4 != 0) {
    pLVar2 = head->data;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; head->sz >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<Lit*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pLVar2,pLVar2 + uVar4,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Lit*,__gnu_cxx::__ops::_Iter_less_iter>(pLVar2);
  }
  uVar5 = head->sz;
  uVar4 = (ulong)uVar5;
  if (uVar4 != 0) {
    uVar8 = 0;
    do {
      uVar1 = head->data[uVar8].x;
      uVar9 = (int)uVar1 >> 1;
      if (*(int *)(sat.c_info.data + uVar9) < 0) {
        iVar7 = sat.c_info.data[uVar9].val;
        if ((uVar1 & 1) == 0) {
          if (iVar10 <= iVar7) {
            iVar10 = iVar7 + 1;
          }
        }
        else if (iVar7 < iVar6) {
          iVar6 = iVar7;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  bVar12 = head->sz != 0;
  local_48 = this;
  if (bVar12) {
    uVar8 = 0;
    do {
      uVar5 = head->data[uVar8].x >> 1;
      if (*(int *)(sat.c_info.data + uVar5) < 0) {
        iVar7 = 7;
      }
      else {
        local_3c = sat.c_info.data[uVar5].val;
        if ((head->data[uVar8].x & 1) == 0) {
          iVar7 = 1;
          uVar4 = (ulong)(uint)(local_3c * 2 + local_48->base_vlit);
        }
        else {
          iVar7 = 7;
          if ((iVar10 <= local_3c) && (local_3c <= iVar6)) {
            if (local_3c == iVar10) {
              iVar10 = iVar10 + 1;
            }
            else if (local_3c == iVar6) {
              iVar6 = iVar6 + -1;
            }
            else {
              local_38 = CONCAT44(local_38._4_4_,(int)uVar4);
              vec<int>::push(&local_58,&local_3c);
              uVar4 = local_38 & 0xffffffff;
              iVar7 = 0;
            }
          }
        }
      }
      uVar5 = (uint)uVar4;
      if ((iVar7 != 7) && (iVar7 != 0)) break;
      uVar8 = uVar8 + 1;
      bVar12 = uVar8 < head->sz;
    } while (bVar12);
  }
  if (!bVar12) {
    if (iVar6 < iVar10) {
      puts("Domain wipeout??");
    }
    fflush(_stdout);
    pIVar11 = local_48;
    if ((iVar10 == local_48->lit_min) && (local_58.sz == 0)) {
      uVar5 = local_48->base_blit + iVar6 * 2 + 2;
    }
    else if ((iVar6 == local_48->lit_max) && (local_58.sz == 0)) {
      uVar5 = (local_48->base_blit + iVar10 * 2) - 1;
    }
    else {
      uVar5 = SAT::getLazyVar(&sat,::ci_null);
      uVar4 = (ulong)uVar5;
      q.x = uVar5 * 2;
      *(byte *)(sat.flags.data + uVar4) = *(byte *)(sat.flags.data + uVar4) & 0xfc;
      *(byte *)(sat.flags.data + uVar4) = *(byte *)(sat.flags.data + uVar4) & 0xfb;
      __ptr = (int *)malloc(8);
      __ptr[0] = -2;
      __ptr[1] = -2;
      __ptr[1] = q.x;
      if (iVar10 == pIVar11->lit_min) {
        SAT::addClause(&sat,(Lit)(*local_58.data * 2 + pIVar11->base_blit),q);
        iVar10 = *local_58.data;
        pIVar11 = local_48;
      }
      if (iVar6 == pIVar11->lit_max) {
        SAT::addClause(&sat,(Lit)(local_48->base_blit + local_58.data[local_58.sz - 1] * 2 + 1),q);
        iVar6 = local_58.data[local_58.sz - 1];
      }
      local_38 = uVar4;
      if (iVar10 <= iVar6) {
        iVar7 = iVar10 * 2;
        uVar5 = 0;
        do {
          if (((int)uVar5 < (int)local_58.sz) && (iVar10 == local_58.data[uVar5])) {
            uVar5 = uVar5 + 1;
          }
          else {
            *__ptr = local_48->base_vlit + iVar7;
            c = (Clause *)malloc(0xc);
            c->data[0].x = -2;
            *(uint *)c = *(uint *)c & 0xfc | 0x200;
            *(undefined8 *)c->data = *(undefined8 *)__ptr;
            SAT::addClause(&sat,c,true);
          }
          iVar10 = iVar10 + 1;
          iVar7 = iVar7 + 2;
        } while (iVar6 + 1 != iVar10);
      }
      uVar5 = (int)local_38 * 2 + 1;
      free(__ptr);
    }
  }
  if (local_58.data != (int *)0x0) {
    free(local_58.data);
  }
  return (Lit)uVar5;
}

Assistant:

Lit IntVarEL::createSetLit(vec<Lit>& head) {
	// lb, ub and holes, which together cause the conflict
	int lower_bound = lit_min;
	int upper_bound = lit_max;
	vec<int> holes;

	std::sort((Lit*)head, (Lit*)head + head.size());

	// process bounds lits first
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 0) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < upper_bound) {
				upper_bound = v;
			}
		} else {
			if (v + 1 > lower_bound) {
				lower_bound = v + 1;
			}
		}
	}

	// process val lits
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 1) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < lower_bound || v > upper_bound) {
				continue;
			}
			if (v == lower_bound) {
				lower_bound++;
				continue;
			}
			if (v == upper_bound) {
				upper_bound--;
				continue;
			}
			holes.push(v);
		} else {
			return getNELit(v);
		}
	}

	if (lower_bound > upper_bound) {
		printf("Domain wipeout??\n");
		assert(false);
	}

	//	printf("lower_bound = %d, upper_bound = %d\n", lower_bound, upper_bound);
	//	for (int i = 0; i < holes.size(); i++) printf("%d ", holes[i]); printf("\n");

	fflush(stdout);

	// Check cases where an original lit is sufficient

	if (lower_bound == lit_min && holes.size() == 0) {
		return getGELit(upper_bound + 1);
	}
	if (upper_bound == lit_max && holes.size() == 0) {
		return getLELit(lower_bound - 1);
	}

	// Create new lit that complements failure set

	Lit q = Lit(sat.getLazyVar(ci_null), true);
	sat.flags[var(q)].setUIPable(false);
	sat.flags[var(q)].setLearnable(false);

	vec<Lit> ps(2);
	ps[1] = ~q;

	if (lower_bound == lit_min) {
		// can use bounds lit for lower bound
		sat.addClause(getGELit(holes[0]), ~q);
		lower_bound = holes[0];
		//		printf("GE: %d\n", holes[0]);
	}
	if (upper_bound == lit_max) {
		// can use bounds lit for upper bound
		sat.addClause(getLELit(holes.last()), ~q);
		upper_bound = holes.last();
		//		printf("LE: %d\n", holes.last());
	}
	int j = 0;
	for (int i = lower_bound; i <= upper_bound; i++) {
		if (j < static_cast<int>(holes.size()) && i == holes[j]) {
			j++;
			continue;
		}
		ps[0] = getNELit(i);
		sat.addClause(*Clause_new(ps), true);
		//		printf("NE: %d\n", i);
	}

	//	printf("New lit = %d\n", toInt(q));

	return q;
}